

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O2

SchemaCatalogEntry * __thiscall
duckdb::Binder::BindCreateFunctionInfo(Binder *this,CreateInfo *info)

{
  pointer puVar1;
  bool bVar2;
  RETURN_TYPE RVar3;
  int iVar4;
  pointer pMVar5;
  ScalarMacroFunction *pSVar6;
  pointer pPVar7;
  iterator iVar8;
  BaseExpression *pBVar9;
  ColumnRefExpression *pCVar10;
  string *__x;
  ConstantExpression *pCVar11;
  ExceptionType *pEVar12;
  SchemaCatalogEntry *pSVar13;
  BinderException *pBVar14;
  pointer this_00;
  __node_base *p_Var15;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *this_01;
  allocator local_6a1;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *local_6a0;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_698;
  DummyBinding *local_690;
  size_type parameter_count;
  CreateInfo *local_680;
  Binder *local_678;
  CreateInfo *local_670;
  Catalog *local_668;
  LogicalDependencyList *local_660;
  DBConfig *local_658;
  unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *local_650;
  _Any_data local_648;
  code *local_638;
  code *local_630;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  dummy_names;
  vector<duckdb::LogicalType,_true> dummy_types;
  BoundGroupInformation group_info;
  string local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  positional_parameters;
  ErrorData error;
  ErrorData local_450;
  SelectBinder binder;
  BoundSelectNode sel_node;
  
  local_660 = &info->dependencies;
  local_668 = Catalog::GetCatalog(this->context,&info->catalog);
  local_658 = DBConfig::GetConfig(this->context);
  positional_parameters._M_h._M_buckets = &positional_parameters._M_h._M_single_bucket;
  positional_parameters._M_h._M_bucket_count = 1;
  positional_parameters._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  positional_parameters._M_h._M_element_count = 0;
  positional_parameters._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  positional_parameters._M_h._M_rehash_policy._M_next_resize = 0;
  positional_parameters._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this_01 = (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *)
            info[1].sql._M_dataplus._M_p;
  local_650 = (unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true> *
              )info[1].sql._M_string_length;
  local_680 = info + 1;
  local_678 = this;
  local_670 = info;
  while( true ) {
    if (this_01 == local_650) {
      pSVar13 = BindCreateSchema(this,local_670);
      ::std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable(&positional_parameters._M_h);
      return pSVar13;
    }
    local_6a0 = this_01;
    pMVar5 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
             operator->(this_01);
    pSVar6 = MacroFunction::Cast<duckdb::ScalarMacroFunction>(pMVar5);
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&pSVar6->expression);
    iVar4 = (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[6])(pPVar7);
    if ((char)iVar4 != '\0') {
      pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&sel_node,"Parameter expressions within macro\'s are not supported!",
                 (allocator *)&group_info);
      BinderException::BinderException(pBVar14,(string *)&sel_node);
      __cxa_throw(pBVar14,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    dummy_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dummy_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    dummy_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dummy_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dummy_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dummy_names.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pMVar5 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
             operator->(local_6a0);
    parameter_count =
         (long)(pMVar5->parameters).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(pMVar5->parameters).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               .
               super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    iVar8 = ::std::
            _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&positional_parameters._M_h,&parameter_count);
    if (iVar8.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
      pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&sel_node,
                 "Ambiguity in macro overloads - macro \"%s\" has multiple definitions with %llu parameters"
                 ,(allocator *)&group_info);
      ::std::__cxx11::string::string((string *)&local_528,(string *)local_680);
      BinderException::BinderException<std::__cxx11::string,unsigned_long>
                (pBVar14,(string *)&sel_node,&local_528,parameter_count);
      __cxa_throw(pBVar14,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    ::std::__detail::
    _Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)&positional_parameters,&parameter_count);
    pMVar5 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
             operator->(local_6a0);
    puVar1 = (pMVar5->parameters).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (pMVar5->parameters).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1;
        this_00 = this_00 + 1) {
      pBVar9 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->(this_00)->super_BaseExpression;
      pCVar10 = BaseExpression::Cast<duckdb::ColumnRefExpression>(pBVar9);
      ColumnRefExpression::ColumnRefExpression((ColumnRefExpression *)&sel_node,pCVar10);
      bVar2 = ColumnRefExpression::IsQualified((ColumnRefExpression *)&sel_node);
      if (bVar2) {
        pBVar14 = (BinderException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&group_info,"Invalid parameter name \'%s\': must be unqualified",
                   (allocator *)&binder);
        ColumnRefExpression::ToString_abi_cxx11_(&local_548,(ColumnRefExpression *)&sel_node);
        BinderException::BinderException<std::__cxx11::string>
                  (pBVar14,(string *)&group_info,&local_548);
        __cxa_throw(pBVar14,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
      emplace_back<duckdb::LogicalTypeId_const&>
                ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&dummy_types,
                 &LogicalType::UNKNOWN);
      __x = ColumnRefExpression::GetColumnName_abi_cxx11_((ColumnRefExpression *)&sel_node);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dummy_names,__x);
      ColumnRefExpression::~ColumnRefExpression((ColumnRefExpression *)&sel_node);
    }
    pMVar5 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
             operator->(local_6a0);
    p_Var15 = &(pMVar5->default_parameters)._M_h._M_before_begin;
    while (p_Var15 = p_Var15->_M_nxt, p_Var15 != (__node_base *)0x0) {
      pBVar9 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                              *)(p_Var15 + 5))->super_BaseExpression;
      pCVar11 = BaseExpression::Cast<duckdb::ConstantExpression>(pBVar9);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&dummy_types,
                 &(pCVar11->value).type_);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dummy_names,(value_type *)(p_Var15 + 1));
    }
    make_uniq<duckdb::DummyBinding,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<std::__cxx11::string,true>&,std::__cxx11::string&>
              ((duckdb *)&local_690,&dummy_types,&dummy_names,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680);
    this = local_678;
    (local_678->macro_binding).ptr = local_690;
    pPVar7 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator->(&pSVar6->expression);
    (*(pPVar7->super_BaseExpression)._vptr_BaseExpression[0xc])(&local_698,pPVar7);
    ExpressionBinder::QualifyColumnNames
              (this,(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     *)&local_698);
    BoundSelectNode::BoundSelectNode(&sel_node);
    group_info.map._M_h._M_buckets = &group_info.map._M_h._M_single_bucket;
    group_info.map._M_h._M_bucket_count = 1;
    group_info.map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    group_info.map._M_h._M_element_count = 0;
    group_info.map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    group_info.map._M_h._M_rehash_policy._M_next_resize = 0;
    group_info.map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    group_info.alias_map._M_h._M_buckets = &group_info.alias_map._M_h._M_single_bucket;
    group_info.alias_map._M_h._M_bucket_count = 1;
    group_info.alias_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    group_info.alias_map._M_h._M_element_count = 0;
    group_info.alias_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    group_info.alias_map._M_h._M_rehash_policy._M_next_resize = 0;
    group_info.alias_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
    group_info.collated_groups._M_h._M_buckets = &group_info.collated_groups._M_h._M_single_bucket;
    group_info.collated_groups._M_h._M_bucket_count = 1;
    group_info.collated_groups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    group_info.collated_groups._M_h._M_element_count = 0;
    group_info.collated_groups._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    group_info.collated_groups._M_h._M_rehash_policy._M_next_resize = 0;
    group_info.collated_groups._M_h._M_single_bucket = (__node_base_ptr)0x0;
    SelectBinder::SelectBinder(&binder,this,this->context,&sel_node,&group_info);
    RVar3 = DBConfig::GetSetting<duckdb::EnableMacroDependenciesSetting>(local_658,this->context);
    if (RVar3) {
      local_648._M_unused._M_object = local_660;
      local_648._8_8_ = local_668;
      local_630 = ::std::
                  _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:236:36)>
                  ::_M_invoke;
      local_638 = ::std::
                  _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:236:36)>
                  ::_M_manager;
      ExpressionBinder::SetCatalogLookupCallback
                ((ExpressionBinder *)&binder,(catalog_entry_callback_t *)&local_648);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_648);
    }
    ErrorData::ErrorData(&error);
    ExpressionBinder::Bind
              (&local_450,(ExpressionBinder *)&binder,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_698,0,false);
    ErrorData::operator=(&error,&local_450);
    ErrorData::~ErrorData(&local_450);
    if (error.initialized == true) break;
    if ((error.initialized & 1U) != 0) {
      pEVar12 = ErrorData::Type(&error);
      if (*pEVar12 != PARAMETER_NOT_RESOLVED) {
        ::std::__cxx11::string::string((string *)&local_450,anon_var_dwarf_3b2a81b + 9,&local_6a1);
        ErrorData::Throw(&error,(string *)&local_450);
      }
    }
    ErrorData::~ErrorData(&error);
    ExpressionBinder::~ExpressionBinder((ExpressionBinder *)&binder);
    BoundGroupInformation::~BoundGroupInformation(&group_info);
    BoundSelectNode::~BoundSelectNode(&sel_node);
    if (local_698._M_head_impl != (ParsedExpression *)0x0) {
      (*((local_698._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if (local_690 != (DummyBinding *)0x0) {
      (*(local_690->super_Binding)._vptr_Binding[1])();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&dummy_names);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&dummy_types);
    this_01 = local_6a0 + 1;
  }
  ::std::__cxx11::string::string((string *)&local_450,anon_var_dwarf_3b2a81b + 9,&local_6a1);
  ErrorData::Throw(&error,(string *)&local_450);
}

Assistant:

SchemaCatalogEntry &Binder::BindCreateFunctionInfo(CreateInfo &info) {
	auto &base = info.Cast<CreateMacroInfo>();

	auto &dependencies = base.dependencies;
	auto &catalog = Catalog::GetCatalog(context, info.catalog);
	auto &db_config = DBConfig::GetConfig(context);
	// try to bind each of the included functions
	unordered_set<idx_t> positional_parameters;
	for (auto &function : base.macros) {
		auto &scalar_function = function->Cast<ScalarMacroFunction>();
		if (scalar_function.expression->HasParameter()) {
			throw BinderException("Parameter expressions within macro's are not supported!");
		}
		vector<LogicalType> dummy_types;
		vector<string> dummy_names;
		auto parameter_count = function->parameters.size();
		if (positional_parameters.find(parameter_count) != positional_parameters.end()) {
			throw BinderException(
			    "Ambiguity in macro overloads - macro \"%s\" has multiple definitions with %llu parameters", base.name,
			    parameter_count);
		}
		positional_parameters.insert(parameter_count);

		// positional parameters
		for (auto &param_expr : function->parameters) {
			auto param = param_expr->Cast<ColumnRefExpression>();
			if (param.IsQualified()) {
				throw BinderException("Invalid parameter name '%s': must be unqualified", param.ToString());
			}
			dummy_types.emplace_back(LogicalType::UNKNOWN);
			dummy_names.push_back(param.GetColumnName());
		}
		// default parameters
		for (auto &entry : function->default_parameters) {
			auto &val = entry.second->Cast<ConstantExpression>();
			dummy_types.push_back(val.value.type());
			dummy_names.push_back(entry.first);
		}
		auto this_macro_binding = make_uniq<DummyBinding>(dummy_types, dummy_names, base.name);
		macro_binding = this_macro_binding.get();

		// create a copy of the expression because we do not want to alter the original
		auto expression = scalar_function.expression->Copy();
		ExpressionBinder::QualifyColumnNames(*this, expression);

		// bind it to verify the function was defined correctly
		BoundSelectNode sel_node;
		BoundGroupInformation group_info;
		SelectBinder binder(*this, context, sel_node, group_info);
		bool should_create_dependencies = db_config.GetSetting<EnableMacroDependenciesSetting>(context);

		if (should_create_dependencies) {
			binder.SetCatalogLookupCallback([&dependencies, &catalog](CatalogEntry &entry) {
				if (&catalog != &entry.ParentCatalog()) {
					// Don't register any cross-catalog dependencies
					return;
				}
				// Register any catalog entry required to bind the macro function
				dependencies.AddDependency(entry);
			});
		}
		ErrorData error;
		try {
			error = binder.Bind(expression, 0, false);
			if (error.HasError()) {
				error.Throw();
			}
		} catch (const std::exception &ex) {
			error = ErrorData(ex);
		}
		// if we cannot resolve parameters we postpone binding until the macro function is used
		if (error.HasError() && error.Type() != ExceptionType::PARAMETER_NOT_RESOLVED) {
			error.Throw();
		}
	}

	return BindCreateSchema(info);
}